

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FloatImage.cpp
# Opt level: O2

void __thiscall
nv::FloatImage::applyKernelVertical
          (FloatImage *this,PolyphaseKernel *k,int x,uint c,uint a,WrapMode wm,float *output)

{
  float fVar1;
  ushort uVar2;
  uint uVar3;
  int iVar4;
  float *pfVar5;
  int iVar6;
  char *pcVar7;
  ulong uVar8;
  int iVar9;
  int iVar10;
  int j;
  float fVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  
  uVar3 = k->m_length;
  uVar2 = this->m_height;
  iVar4 = k->m_windowSize;
  fVar1 = k->m_width;
  pfVar5 = this->m_mem;
  iVar10 = (uint)this->m_width * (uint)uVar2;
  uVar8 = 0;
  iVar9 = 0;
  if (0 < iVar4) {
    iVar9 = iVar4;
  }
  for (; uVar8 != uVar3; uVar8 = uVar8 + 1) {
    fVar11 = ((float)(uVar8 & 0xffffffff) + 0.5) * (1.0 / ((float)uVar3 / (float)uVar2));
    fVar12 = floorf(fVar11 - fVar1);
    fVar11 = ceilf(fVar11 + fVar1);
    if (iVar4 < (int)fVar11 - (int)fVar12) {
      iVar6 = nvAbort("right - left <= windowSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/abramcumner[P]xray_re-tools/sources/3rd party/nvtt/nvimage/FloatImage.cpp"
                      ,0x348,
                      "void nv::FloatImage::applyKernelVertical(const PolyphaseKernel &, int, uint, uint, WrapMode, float *__restrict) const"
                     );
      if (iVar6 == 1) {
        raise(5);
      }
    }
    fVar14 = 0.0;
    fVar11 = 0.0;
    for (iVar6 = 0; iVar9 != iVar6; iVar6 = iVar6 + 1) {
      pcVar7 = index(this,(char *)(ulong)(uint)x,(int)fVar12 + iVar6);
      fVar13 = (pfVar5[(ulong)(iVar10 * a) + (long)(int)pcVar7] + 0.00390625) *
               k->m_data[(uint)(k->m_windowSize * (int)uVar8 + iVar6)];
      fVar14 = fVar14 + fVar13;
      fVar11 = fVar11 + fVar13 * pfVar5[(ulong)(c * iVar10) + (long)(int)pcVar7];
    }
    output[uVar8] = fVar11 / fVar14;
  }
  return;
}

Assistant:

void FloatImage::applyKernelVertical(const PolyphaseKernel & k, int x, uint c, uint a, WrapMode wm, float * __restrict output) const
{
	const uint length = k.length();
	const float scale = float(length) / float(m_height);
	const float iscale = 1.0f / scale;

	const float width = k.width();
	const int windowSize = k.windowSize();

	const float * channel = this->channel(c);
	const float * alpha = this->channel(a);

	for (uint i = 0; i < length; i++)
	{
		const float center = (0.5f + i) * iscale;
		
		const int left = (int)floorf(center - width);
		const int right = (int)ceilf(center + width);
		nvCheck(right - left <= windowSize);
		
		float norm = 0;
		float sum = 0;
		for (int j = 0; j < windowSize; ++j)
		{
			const int idx = this->index(x, j+left, wm);
			
			float w = k.valueAt(i, j) * (alpha[idx] + (1.0f / 256.0f));
			norm += w;
			sum += w * channel[idx];
		}
		
		output[i] = sum / norm;
	}
}